

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O3

int __thiscall
MatroskaDemuxer::matroska_parse_blockgroup(MatroskaDemuxer *this,int64_t cluster_time)

{
  int *levelUp;
  _Map_pointer pppAVar1;
  _Map_pointer pppAVar2;
  _Elt_pointer ppAVar3;
  _Elt_pointer ppAVar4;
  _Elt_pointer ppAVar5;
  _Elt_pointer ppAVar6;
  _Map_pointer pppAVar7;
  AVPacket **ppAVar8;
  int iVar9;
  AVPacket **ppAVar10;
  int is_keyframe;
  int size;
  uint32_t id;
  uint8_t *data;
  int in_stack_ffffffffffffff90;
  int local_60;
  uint32_t local_5c;
  uint32_t local_58;
  undefined4 uStack_54;
  int64_t local_50;
  int64_t local_48;
  uint8_t *local_40;
  int64_t local_38;
  
  pppAVar1 = (this->packets).c.super__Deque_base<AVPacket_*,_std::allocator<AVPacket_*>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node;
  pppAVar2 = (this->packets).c.super__Deque_base<AVPacket_*,_std::allocator<AVPacket_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_node;
  ppAVar3 = (this->packets).c.super__Deque_base<AVPacket_*,_std::allocator<AVPacket_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_last;
  ppAVar4 = (this->packets).c.super__Deque_base<AVPacket_*,_std::allocator<AVPacket_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  ppAVar5 = (this->packets).c.super__Deque_base<AVPacket_*,_std::allocator<AVPacket_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_first;
  ppAVar6 = (this->packets).c.super__Deque_base<AVPacket_*,_std::allocator<AVPacket_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  local_40 = (uint8_t *)0x0;
  local_60 = 0;
  levelUp = &this->level_up;
  local_50 = -0x8000000000000000;
  iVar9 = 0;
  is_keyframe = 1;
  local_48 = 0;
  local_38 = cluster_time;
  do {
    if (iVar9 != 0) {
      return iVar9;
    }
    iVar9 = ebml_read_element_id(this,&local_58,levelUp);
    if (iVar9 < 0) {
      return -1;
    }
    if (local_58 == 0) {
      return -1;
    }
    if (*levelUp != 0) {
      *levelUp = *levelUp + -1;
      goto LAB_0019bc91;
    }
    if ((int)local_58 < 0xbf) {
      if (local_58 == 0x9b) {
        iVar9 = ebml_read_uint(this,&local_5c,(int64_t *)&local_58);
        if (-1 < iVar9) {
          local_50 = CONCAT44(uStack_54,local_58);
        }
      }
      else {
        if (local_58 != 0xa1) goto LAB_0019bc49;
        local_48 = (this->super_IOContextDemuxer).m_processedBytes;
        iVar9 = ebml_read_binary(this,&local_5c,&local_40,&local_60);
      }
    }
    else if (((local_58 == 0xbf) || (local_58 == 0xec)) || (local_58 != 0xfb)) {
LAB_0019bc49:
      iVar9 = ebml_read_skip(this);
    }
    else {
      pppAVar7 = (this->packets).c.super__Deque_base<AVPacket_*,_std::allocator<AVPacket_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node;
      ppAVar10 = (this->packets).c.super__Deque_base<AVPacket_*,_std::allocator<AVPacket_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_cur;
      ppAVar8 = (this->packets).c.super__Deque_base<AVPacket_*,_std::allocator<AVPacket_*>_>._M_impl
                .super__Deque_impl_data._M_finish._M_first;
      if (((long)ppAVar3 - (long)ppAVar6 >> 3) + ((long)ppAVar4 - (long)ppAVar5 >> 3) +
          ((((ulong)((long)pppAVar1 - (long)pppAVar2) >> 3) - 1) +
          (ulong)(pppAVar1 == (_Map_pointer)0x0)) * 0x40 !=
          ((long)(this->packets).c.super__Deque_base<AVPacket_*,_std::allocator<AVPacket_*>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_last -
           (long)(this->packets).c.super__Deque_base<AVPacket_*,_std::allocator<AVPacket_*>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
          ((long)ppAVar10 - (long)ppAVar8 >> 3) +
          ((((ulong)((long)pppAVar7 -
                    (long)(this->packets).c.
                          super__Deque_base<AVPacket_*,_std::allocator<AVPacket_*>_>._M_impl.
                          super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
          (ulong)(pppAVar7 == (_Map_pointer)0x0)) * 0x40) {
        if (ppAVar10 == ppAVar8) {
          ppAVar10 = pppAVar7[-1] + 0x40;
        }
        ppAVar10[-1]->flags = 0;
      }
      iVar9 = ebml_read_sint(this,&local_5c,(int64_t *)&local_58);
      is_keyframe = 0;
    }
  } while (*levelUp == 0);
  *levelUp = *levelUp + -1;
  if (iVar9 == 0) {
LAB_0019bc91:
    if (local_40 == (uint8_t *)0x0) {
      iVar9 = 0;
    }
    else {
      iVar9 = matroska_parse_block
                        (this,local_40,local_60,local_48,local_38,local_50,is_keyframe,
                         in_stack_ffffffffffffff90);
    }
  }
  return iVar9;
}

Assistant:

int MatroskaDemuxer::matroska_parse_blockgroup(const int64_t cluster_time)
{
    int res = 0;
    uint32_t id;
    int is_bframe = 0;
    int is_keyframe = PKT_FLAG_KEY;
    const size_t last_num_packets = packets.size();
    int64_t duration = AV_NOPTS_VALUE;
    uint8_t *data = nullptr;
    int size = 0;
    int64_t pos = 0;

    while (res == 0)
    {
        if ((id = ebml_peek_id(&level_up)) == 0)
        {
            res = -BufferedReader::DATA_EOF;
            break;
        }
        if (level_up)
        {
            level_up--;
            break;
        }

        switch (id)
        {
        /* one block inside the group. Note, block parsing is one
         * of the harder things, so this code is a bit complicated.
         * See http://www.matroska.org/ for documentation. */
        case MATROSKA_ID_BLOCK:
        {
            pos = m_processedBytes;
            res = ebml_read_binary(&id, &data, &size);
            break;
        }

        case MATROSKA_ID_BLOCKDURATION:
        {
            int64_t num;
            if ((res = ebml_read_uint(&id, &num)) < 0)
                break;
            duration = num;
            break;
        }

        case MATROSKA_ID_BLOCKREFERENCE:
        {
            int64_t num;
            /* We've found a reference, so not even the first frame in
             * the lace is a key frame. */
            is_keyframe = 0;
            if (last_num_packets != packets.size())
                packets.back()->flags = 0;
            if ((res = ebml_read_sint(&id, &num)) < 0)
                break;
            if (num > 0)
                is_bframe = 1;
            break;
        }
        case EBML_ID_VOID:
        case EBML_ID_CRC32:
            res = ebml_read_skip();
            break;
        default:
            res = ebml_read_skip();
            LTRACE(LT_INFO, 0, "Unknown entry " << id << " in blockgroup data");
        }

        if (level_up)
        {
            level_up--;
            break;
        }
    }

    if (res)
        return res;

    if (data != nullptr)
        res = matroska_parse_block(data, size, pos, cluster_time, duration, is_keyframe, is_bframe);

    return res;
}